

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O0

bool stl_reader::
     ReadStlFile_ASCII<lume::ArrayAnnex<float>,lume::ArrayAnnex<float>,lume::ArrayAnnex<unsigned_int>,lume::ArrayAnnex<unsigned_int>>
               (char *filename,ArrayAnnex<float> *coordsOut,ArrayAnnex<float> *normalsOut,
               ArrayAnnex<unsigned_int> *trisOut,ArrayAnnex<unsigned_int> *solidRangesOut)

{
  byte bVar1;
  int iVar2;
  index_t iVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  char *pcVar6;
  float *pfVar7;
  size_type sVar8;
  reference pvVar9;
  double dVar10;
  byte local_ead;
  byte local_eaa;
  uint local_e90;
  uint local_e8c;
  uint local_e88;
  uint local_e84;
  uint local_e80;
  undefined1 local_e79;
  string local_e78 [32];
  stringstream local_e58 [8];
  stringstream ss_5;
  ostream local_e48 [383];
  undefined1 local_cc9;
  string local_cc8 [32];
  stringstream local_ca8 [8];
  stringstream ss_4;
  ostream local_c98 [380];
  float local_b1c;
  ulong local_b18;
  size_t i_1;
  string local_b08 [32];
  stringstream local_ae8 [8];
  stringstream ss_3;
  ostream local_ad8 [383];
  undefined1 local_959;
  string local_958 [32];
  stringstream local_938 [8];
  stringstream ss_2;
  ostream local_928 [376];
  ulong local_7b0;
  size_t i;
  CoordWithIndex<float,_unsigned_int> c;
  stringstream local_770 [8];
  stringstream ss_1;
  ostream local_760 [376];
  reference local_5e8;
  string *tok;
  istringstream aiStack_5d8 [4];
  int tokenCount;
  istringstream line;
  long local_458;
  size_t numFaceVrts;
  int maxNumTokens;
  int lineCount;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string buffer;
  undefined1 local_410 [8];
  vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  coordsWithIndex;
  string local_3f0 [32];
  stringstream local_3d0 [8];
  stringstream ss;
  ostream local_3c0 [392];
  long local_238;
  ifstream in;
  ArrayAnnex<unsigned_int> *solidRangesOut_local;
  ArrayAnnex<unsigned_int> *trisOut_local;
  ArrayAnnex<float> *normalsOut_local;
  ArrayAnnex<float> *coordsOut_local;
  char *filename_local;
  
  lume::ArrayAnnex<float>::clear(coordsOut);
  lume::ArrayAnnex<float>::clear(normalsOut);
  lume::ArrayAnnex<unsigned_int>::clear(trisOut);
  lume::ArrayAnnex<unsigned_int>::clear(solidRangesOut);
  std::ifstream::ifstream(&local_238,filename,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_3d0);
    poVar4 = std::operator<<(local_3c0,"Couldn\'t open file ");
    std::operator<<(poVar4,filename);
    coordsWithIndex.
    super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar5,local_3f0);
    coordsWithIndex.
    super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  ::vector((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
            *)local_410);
  std::__cxx11::string::string
            ((string *)
             &tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&maxNumTokens);
  numFaceVrts._4_4_ = 1;
  numFaceVrts._0_4_ = 0;
  local_458 = 0;
  do {
    bVar1 = std::ios::eof();
    local_eaa = 1;
    if ((bVar1 & 1) == 0) {
      local_eaa = std::ios::fail();
    }
    if (((local_eaa ^ 0xff) & 1) == 0) {
      iVar3 = lume::ArrayAnnex<unsigned_int>::size(trisOut);
      local_e90 = iVar3 / 3;
      lume::ArrayAnnex<unsigned_int>::push_back(solidRangesOut,&local_e90);
      stl_reader_impl::RemoveDoubles<lume::ArrayAnnex<float>,lume::ArrayAnnex<unsigned_int>>
                (coordsOut,trisOut,
                 (vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                  *)local_410);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&maxNumTokens);
      std::__cxx11::string::~string
                ((string *)
                 &tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
      ::~vector((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                 *)local_410);
      std::ifstream::~ifstream(&local_238);
      return true;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_238,
               (string *)
               &tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::istringstream::istringstream
              (aiStack_5d8,
               (string *)
               &tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,_S_in);
    tok._4_4_ = 0;
    while( true ) {
      bVar1 = std::ios::eof();
      local_ead = 1;
      if ((bVar1 & 1) == 0) {
        local_ead = std::ios::fail();
      }
      if (((local_ead ^ 0xff) & 1) == 0) break;
      if ((int)numFaceVrts <= tok._4_4_) {
        numFaceVrts._0_4_ = tok._4_4_ + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&maxNumTokens,(long)(int)numFaceVrts);
      }
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&maxNumTokens,(long)tok._4_4_);
      std::operator>>((istream *)aiStack_5d8,(string *)pvVar9);
      tok._4_4_ = tok._4_4_ + 1;
    }
    if (0 < tok._4_4_) {
      local_5e8 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&maxNumTokens,0);
      iVar2 = std::__cxx11::string::compare((char *)local_5e8);
      if (iVar2 == 0) {
        if (tok._4_4_ < 4) {
          std::__cxx11::stringstream::stringstream(local_770);
          poVar4 = std::operator<<(local_760,"ERROR while reading from ");
          poVar4 = std::operator<<(poVar4,filename);
          poVar4 = std::operator<<(poVar4,": vertex not specified correctly in line ");
          std::ostream::operator<<(poVar4,numFaceVrts._4_4_);
          c.data[2]._3_1_ = 1;
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringstream::str();
          std::runtime_error::runtime_error(prVar5,(string *)&c.index);
          c.data[2]._3_1_ = 0;
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        for (local_7b0 = 0; local_7b0 < 3; local_7b0 = local_7b0 + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&maxNumTokens,local_7b0 + 1);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          dVar10 = atof(pcVar6);
          pfVar7 = stl_reader_impl::CoordWithIndex<float,_unsigned_int>::operator[]
                             ((CoordWithIndex<float,_unsigned_int> *)((long)&i + 4),local_7b0);
          *pfVar7 = (float)dVar10;
        }
        sVar8 = std::
                vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                ::size((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                        *)local_410);
        c.data[1] = (float)sVar8;
        std::
        vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
        ::push_back((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                     *)local_410,(value_type *)((long)&i + 4));
        local_458 = local_458 + 1;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)local_5e8);
        if (iVar2 == 0) {
          if (tok._4_4_ < 5) {
            std::__cxx11::stringstream::stringstream(local_938);
            poVar4 = std::operator<<(local_928,"ERROR while reading from ");
            poVar4 = std::operator<<(poVar4,filename);
            poVar4 = std::operator<<(poVar4,": triangle not specified correctly in line ");
            std::ostream::operator<<(poVar4,numFaceVrts._4_4_);
            local_959 = 1;
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringstream::str();
            std::runtime_error::runtime_error(prVar5,local_958);
            local_959 = 0;
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&maxNumTokens,1);
          iVar2 = std::__cxx11::string::compare((char *)pvVar9);
          if (iVar2 != 0) {
            std::__cxx11::stringstream::stringstream(local_ae8);
            poVar4 = std::operator<<(local_ad8,"ERROR while reading from ");
            poVar4 = std::operator<<(poVar4,filename);
            poVar4 = std::operator<<(poVar4,": Missing normal specifier in line ");
            std::ostream::operator<<(poVar4,numFaceVrts._4_4_);
            i_1._7_1_ = 1;
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringstream::str();
            std::runtime_error::runtime_error(prVar5,local_b08);
            i_1._7_1_ = 0;
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          for (local_b18 = 0; local_b18 < 3; local_b18 = local_b18 + 1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&maxNumTokens,local_b18 + 2);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            dVar10 = atof(pcVar6);
            local_b1c = (float)dVar10;
            lume::ArrayAnnex<float>::push_back(normalsOut,&local_b1c);
          }
          local_458 = 0;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)local_5e8);
          if (iVar2 == 0) {
            if (tok._4_4_ < 2) {
LAB_00230b0a:
              std::__cxx11::stringstream::stringstream(local_ca8);
              poVar4 = std::operator<<(local_c98,"ERROR while reading from ");
              poVar4 = std::operator<<(poVar4,filename);
              poVar4 = std::operator<<(poVar4,": expecting outer loop in line ");
              std::ostream::operator<<(poVar4,numFaceVrts._4_4_);
              local_cc9 = 1;
              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringstream::str();
              std::runtime_error::runtime_error(prVar5,local_cc8);
              local_cc9 = 0;
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&maxNumTokens,1);
            iVar2 = std::__cxx11::string::compare((char *)pvVar9);
            if (iVar2 != 0) goto LAB_00230b0a;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)local_5e8);
            if (iVar2 == 0) {
              if (local_458 != 3) {
                std::__cxx11::stringstream::stringstream(local_e58);
                poVar4 = std::operator<<(local_e48,"ERROR while reading from ");
                poVar4 = std::operator<<(poVar4,filename);
                poVar4 = std::operator<<(poVar4,
                                         ": bad number of vertices specified for face in line ");
                std::ostream::operator<<(poVar4,numFaceVrts._4_4_);
                local_e79 = 1;
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringstream::str();
                std::runtime_error::runtime_error(prVar5,local_e78);
                local_e79 = 0;
                __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              sVar8 = std::
                      vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                      ::size((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                              *)local_410);
              local_e80 = (int)sVar8 - 3;
              lume::ArrayAnnex<unsigned_int>::push_back(trisOut,&local_e80);
              sVar8 = std::
                      vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                      ::size((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                              *)local_410);
              local_e84 = (int)sVar8 - 2;
              lume::ArrayAnnex<unsigned_int>::push_back(trisOut,&local_e84);
              sVar8 = std::
                      vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                      ::size((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                              *)local_410);
              local_e88 = (int)sVar8 - 1;
              lume::ArrayAnnex<unsigned_int>::push_back(trisOut,&local_e88);
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)local_5e8);
              if (iVar2 == 0) {
                iVar3 = lume::ArrayAnnex<unsigned_int>::size(trisOut);
                local_e8c = iVar3 / 3;
                lume::ArrayAnnex<unsigned_int>::push_back(solidRangesOut,&local_e8c);
              }
            }
          }
        }
      }
    }
    numFaceVrts._4_4_ = numFaceVrts._4_4_ + 1;
    std::__cxx11::istringstream::~istringstream(aiStack_5d8);
  } while( true );
}

Assistant:

bool ReadStlFile_ASCII(const char* filename,
                       TNumberContainer1& coordsOut,
                       TNumberContainer2& normalsOut,
                       TIndexContainer1& trisOut,
					   TIndexContainer2& solidRangesOut)
{
	using namespace std;
	using namespace stl_reader_impl;

	typedef typename TNumberContainer1::value_type	number_t;
	typedef typename TIndexContainer1::value_type	index_t;

	coordsOut.clear();
	normalsOut.clear();
	trisOut.clear();
	solidRangesOut.clear();

	ifstream in(filename);
	STL_READER_COND_THROW(!in, "Couldn't open file " << filename);

	vector<CoordWithIndex <number_t, index_t> > coordsWithIndex;

	string buffer;
	vector<string> tokens;
	int lineCount = 1;
	int maxNumTokens = 0;
	size_t numFaceVrts = 0;

	while(!(in.eof() || in.fail()))
	{
	//	read the line and tokenize.
	//	In order to reuse memory in between lines, 'tokens' won't be cleared.
	//	Instead we count the number of tokens using 'tokenCount'.
		getline(in, buffer);

		istringstream line(buffer);
		int tokenCount = 0;
		while(!(line.eof() || line.fail())){
			if(tokenCount >= maxNumTokens){
				maxNumTokens = tokenCount + 1;
				tokens.resize(maxNumTokens);
			}
			line >> tokens[tokenCount];
			++tokenCount;
		}

		if(tokenCount > 0)
		{
			string& tok = tokens[0];
			if(tok.compare("vertex") == 0){
				if(tokenCount < 4){
					STL_READER_THROW("ERROR while reading from " << filename <<
						": vertex not specified correctly in line " << lineCount);
				}
				
			//	read the position
				CoordWithIndex <number_t, index_t> c;
				for(size_t i = 0; i < 3; ++i)
					c[i] = static_cast<number_t> (atof(tokens[i+1].c_str()));
				c.index = static_cast<index_t>(coordsWithIndex.size());
				coordsWithIndex.push_back(c);
				++numFaceVrts;
			}
			else if(tok.compare("facet") == 0)
			{
				STL_READER_COND_THROW(tokenCount < 5,
						"ERROR while reading from " << filename <<
						": triangle not specified correctly in line " << lineCount);
				
				STL_READER_COND_THROW(tokens[1].compare("normal") != 0,
						"ERROR while reading from " << filename <<
						": Missing normal specifier in line " << lineCount);
				
			//	read the normal
				for(size_t i = 0; i < 3; ++i)
					normalsOut.push_back (static_cast<number_t> (atof(tokens[i+2].c_str())));

				numFaceVrts = 0;
			}
			else if(tok.compare("outer") == 0){
				STL_READER_COND_THROW ((tokenCount < 2) || (tokens[1].compare("loop") != 0),
				    "ERROR while reading from " << filename <<
					": expecting outer loop in line " << lineCount);
			}
			else if(tok.compare("endfacet") == 0){
				STL_READER_COND_THROW(numFaceVrts != 3,
					"ERROR while reading from " << filename <<
					": bad number of vertices specified for face in line " << lineCount);

				trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 3));
				trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 2));
				trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 1));
			}
			else if(tok.compare("solid") == 0){
				solidRangesOut.push_back(static_cast<index_t> (trisOut.size() / 3));
			}
		}
		lineCount++;
	}

	solidRangesOut.push_back(static_cast<index_t> (trisOut.size() / 3));

	RemoveDoubles (coordsOut, trisOut, coordsWithIndex);

	return true;
}